

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateMergingCode
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  char *text;
  
  text = 
  "if (other.has$capitalized_name$()) {\n  $set_has_field_bit_builder$\n  $name$_ = other.$name$_;\n  $on_changed$\n}\n"
  ;
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) == 3) {
    text = 
    "if (!other.get$capitalized_name$().isEmpty()) {\n  $name$_ = other.$name$_;\n  $on_changed$\n}\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutableStringFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    // Allow a slight breach of abstraction here in order to avoid forcing
    // all string fields to Strings when copying fields from a Message.
    printer->Print(variables_,
      "if (other.has$capitalized_name$()) {\n"
      "  $set_has_field_bit_builder$\n"
      "  $name$_ = other.$name$_;\n"
      "  $on_changed$\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "if (!other.get$capitalized_name$().isEmpty()) {\n"
      "  $name$_ = other.$name$_;\n"
      "  $on_changed$\n"
      "}\n");
  }
}